

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O0

void __thiscall
soplex::SPxLPBase<double>::changeRhs(SPxLPBase<double> *this,VectorBase<double> *newRhs,bool scale)

{
  int iVar1;
  double *pdVar2;
  byte in_DL;
  VectorBase<double> *in_RSI;
  LPRowSetBase<double> *in_RDI;
  double dVar3;
  int i;
  undefined8 in_stack_ffffffffffffffb8;
  VectorBase<double> *in_stack_ffffffffffffffc0;
  LPRowSetBase<double> *this_00;
  int local_18;
  
  if ((in_DL & 1) == 0) {
    LPRowSetBase<double>::rhs_w(in_RDI);
    VectorBase<double>::operator=(in_stack_ffffffffffffffc0,in_RSI);
  }
  else {
    local_18 = 0;
    while( true ) {
      rhs((SPxLPBase<double> *)0x2609e5);
      iVar1 = VectorBase<double>::dim((VectorBase<double> *)0x2609ed);
      if (iVar1 <= local_18) break;
      this_00 = (LPRowSetBase<double> *)
                in_RDI[2].super_SVSetBase<double>.super_ClassArray<soplex::Nonzero<double>_>.
                memFactor;
      pdVar2 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)this_00,
                          (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
      dVar3 = (double)(*(code *)(((_Vector_impl *)
                                 &(this_00->super_SVSetBase<double>).
                                  super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray)->
                                super__Vector_impl_data)._M_start[0x2e])
                                (*pdVar2,this_00,in_RDI,local_18);
      pdVar2 = LPRowSetBase<double>::rhs_w(this_00,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
      *pdVar2 = dVar3;
      local_18 = local_18 + 1;
    }
  }
  return;
}

Assistant:

virtual void changeRhs(const VectorBase<R>& newRhs, bool scale = false)
   {
      assert(rhs().dim() == newRhs.dim());

      if(scale)
      {
         assert(_isScaled);
         assert(lp_scaler);

         for(int i = 0; i < rhs().dim(); i++)
            LPRowSetBase<R>::rhs_w(i) = lp_scaler->scaleRhs(*this, i, newRhs[i]);
      }
      else
         LPRowSetBase<R>::rhs_w() = newRhs;

      assert(isConsistent());
   }